

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Promise<NoCopy>_>::dispose(ArrayBuilder<kj::Promise<NoCopy>_> *this)

{
  Promise<NoCopy> *firstElement;
  RemoveConst<kj::Promise<NoCopy>_> *pRVar1;
  Promise<NoCopy> *pPVar2;
  Promise<NoCopy> *endCopy;
  Promise<NoCopy> *posCopy;
  Promise<NoCopy> *ptrCopy;
  ArrayBuilder<kj::Promise<NoCopy>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pPVar2 = this->endPtr;
  if (firstElement != (Promise<NoCopy> *)0x0) {
    this->ptr = (Promise<NoCopy> *)0x0;
    this->pos = (RemoveConst<kj::Promise<NoCopy>_> *)0x0;
    this->endPtr = (Promise<NoCopy> *)0x0;
    ArrayDisposer::dispose<kj::Promise<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 3,
               (long)pPVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }